

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ActivationSoftplus * __thiscall
CoreML::Specification::ActivationParams::mutable_softplus(ActivationParams *this)

{
  bool bVar1;
  ActivationSoftplus *this_00;
  ActivationParams *this_local;
  
  bVar1 = has_softplus(this);
  if (!bVar1) {
    clear_NonlinearityType(this);
    set_has_softplus(this);
    this_00 = (ActivationSoftplus *)operator_new(0x18);
    ActivationSoftplus::ActivationSoftplus(this_00);
    (this->NonlinearityType_).softplus_ = this_00;
  }
  return (ActivationSoftplus *)(this->NonlinearityType_).linear_;
}

Assistant:

inline ::CoreML::Specification::ActivationSoftplus* ActivationParams::mutable_softplus() {
  if (!has_softplus()) {
    clear_NonlinearityType();
    set_has_softplus();
    NonlinearityType_.softplus_ = new ::CoreML::Specification::ActivationSoftplus;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ActivationParams.softplus)
  return NonlinearityType_.softplus_;
}